

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# progressbar.cpp
# Opt level: O3

bool __thiscall QtMWidgets::ProgressBarPrivate::repaintRequired(ProgressBarPrivate *this)

{
  long lVar1;
  int iVar2;
  int iVar3;
  ulong uVar4;
  
  iVar3 = this->value - this->lastPaintedValue;
  if (iVar3 == 0) {
    return false;
  }
  iVar2 = -iVar3;
  if (0 < iVar3) {
    iVar2 = iVar3;
  }
  uVar4 = (ulong)(this->orientation != Horizontal);
  lVar1 = *(long *)&this->q->field_0x20;
  return this->maximum - this->minimum <
         ((*(int *)(lVar1 + 0x1c + uVar4 * 4) - *(int *)(lVar1 + 0x14 + uVar4 * 4)) + 1) * iVar2;
}

Assistant:

bool
ProgressBarPrivate::repaintRequired() const
{
	if( value == lastPaintedValue )
		return false;

	const int valueDifference = qAbs( value - lastPaintedValue );

	const int grooveBlock = ( orientation == Qt::Horizontal ? grooveRect().width() :
		grooveRect().height() );

	// This expression is basically
	// ( valueDifference / 1 > ( maximum - minimum ) / grooveBlock )
	// transformed to avoid integer division.
	return ( valueDifference * grooveBlock > ( maximum - minimum ) );
}